

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *pInLimit;
  long *plVar1;
  BYTE *pBVar2;
  undefined8 *puVar3;
  U32 UVar4;
  U32 *pUVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  ulong s;
  undefined8 uVar8;
  U32 lowestValid;
  size_t sVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int *piVar18;
  int iVar19;
  int *piVar20;
  uint local_b0;
  size_t offbaseFound;
  uint local_9c;
  ulong local_98;
  uint local_90;
  int local_8c;
  ulong local_88;
  int *local_80;
  int *local_78;
  ulong local_70;
  int *local_68;
  BYTE *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  size_t local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_60 = (ms->window).base;
  uVar17 = (ms->window).dictLimit;
  local_40 = local_60 + uVar17;
  uVar15 = (ms->cParams).minMatch;
  if (5 < uVar15) {
    uVar15 = 6;
  }
  if (uVar15 < 5) {
    uVar15 = 4;
  }
  local_9c = (ms->cParams).searchLog;
  uVar14 = 6;
  if (local_9c < 6) {
    uVar14 = local_9c;
  }
  if (uVar14 < 5) {
    uVar14 = 4;
  }
  local_78 = (int *)((ulong)((int)src == (int)local_40) + (long)src);
  uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar19 = (int)local_78 - (int)local_60;
  local_50 = *rep;
  local_4c = iVar19 - uVar16;
  if (iVar19 - uVar17 <= uVar16) {
    local_4c = uVar17;
  }
  uVar16 = 0;
  if (ms->loadedDictEnd != 0) {
    local_4c = uVar17;
  }
  local_54 = rep[1];
  local_4c = iVar19 - local_4c;
  local_b0 = local_54;
  if (local_4c < local_54) {
    local_b0 = uVar16;
  }
  local_90 = local_50;
  if (local_4c < local_50) {
    local_90 = uVar16;
  }
  ms->lazySkipping = 0;
  local_68 = (int *)((long)src + (srcSize - 0x10));
  piVar20 = (int *)(ulong)ms->nextToUpdate;
  uVar17 = ((int)local_68 - (int)(local_60 + (long)piVar20)) + 1;
  if (7 < uVar17) {
    uVar17 = 8;
  }
  if (local_68 < local_60 + (long)piVar20) {
    uVar17 = uVar16;
  }
  pInLimit = (int *)((long)src + srcSize);
  local_80 = (int *)(ulong)(uVar17 + ms->nextToUpdate);
  UVar4 = ms->rowHashLog;
  local_70 = (ulong)(0x38 - UVar4);
  local_8c = 0x18 - UVar4;
  bVar12 = (byte)uVar14;
  local_48 = 1L << (bVar12 & 0x3f);
  local_98 = CONCAT44(local_98._4_4_,UVar4 + 8);
  pUVar5 = ms->hashTable;
  pBVar6 = ms->tagTable;
  local_38 = rep;
  for (; piVar20 < local_80; piVar20 = (int *)((long)piVar20 + 1)) {
    if (0x20 < (uint)local_98) {
LAB_00155b88:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_60 + (long)piVar20);
    uVar10 = ms->hashSalt;
    if (uVar15 == 5) {
      sVar9 = (*plVar1 * -0x30e4432345000000 ^ uVar10) >> ((byte)local_70 & 0x3f);
    }
    else if (uVar15 == 6) {
      sVar9 = ZSTD_hash6PtrS(plVar1,(uint)local_98,uVar10);
    }
    else {
      sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar10) >> ((byte)local_8c & 0x1f));
    }
    uVar17 = ((uint)(sVar9 >> 8) & 0xffffff) << (bVar12 & 0x1f);
    if (((ulong)(pUVar5 + uVar17) & 0x3f) != 0) {
LAB_00155ba7:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar19 = ZSTD_isAligned(pBVar6 + uVar17,local_48);
    if (iVar19 == 0) {
LAB_00155bc6:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    ms->hashCache[(uint)piVar20 & 7] = (U32)sVar9;
  }
  local_80 = pInLimit + -8;
  piVar20 = local_78;
  piVar18 = local_68;
  uVar17 = local_90;
  do {
    local_98 = -(ulong)uVar17;
    while( true ) {
      if (piVar18 <= piVar20) {
        if (local_54 <= local_4c) {
          local_54 = 0;
        }
        uVar15 = local_54;
        if (uVar17 != 0) {
          uVar15 = local_50;
        }
        if (local_50 <= local_4c) {
          uVar15 = local_54;
          local_50 = 0;
        }
        if (uVar17 != 0) {
          local_50 = uVar17;
        }
        if (local_b0 != 0) {
          uVar15 = local_b0;
        }
        *local_38 = local_50;
        local_38[1] = uVar15;
        return (long)pInLimit - (long)src;
      }
      uVar16 = uVar17;
      if ((uVar17 != 0) && (*(int *)((long)piVar20 + local_98 + 1) == *(int *)((long)piVar20 + 1)))
      {
        sVar11 = ZSTD_count((BYTE *)((long)piVar20 + 5),(BYTE *)((long)piVar20 + local_98 + 5),
                            (BYTE *)pInLimit);
        sVar9 = 1;
        piVar20 = (int *)((long)piVar20 + 1);
        local_88 = sVar11 + 4;
        goto LAB_00155727;
      }
      offbaseFound = 999999999;
      if (uVar15 == 6) {
        if (uVar14 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_6
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar14 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_5
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_noDict_6_4
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar15 == 5) {
        if (uVar14 == 6) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_6
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
        else if (uVar14 == 5) {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_5
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
        else {
          uVar10 = ZSTD_RowFindBestMatch_noDict_5_4
                             (ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound);
        }
      }
      else if (uVar14 == 6) {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_6(ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else if (uVar14 == 5) {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_5(ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      else {
        uVar10 = ZSTD_RowFindBestMatch_noDict_4_4(ms,(BYTE *)piVar20,(BYTE *)pInLimit,&offbaseFound)
        ;
      }
      if (3 < uVar10) break;
      uVar10 = (long)piVar20 - (long)src;
      piVar20 = (int *)((long)piVar20 + (uVar10 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar10);
    }
    sVar9 = offbaseFound;
    local_88 = uVar10;
    if (3 < offbaseFound) {
      for (; ((src < piVar20 && (local_40 < (BYTE *)((long)piVar20 + (3 - offbaseFound)))) &&
             (*(char *)((long)piVar20 + -1) == *(char *)((long)piVar20 + (2 - offbaseFound))));
          piVar20 = (int *)((long)piVar20 + -1)) {
        local_88 = local_88 + 1;
      }
      uVar16 = (int)offbaseFound - 3;
      local_b0 = uVar17;
    }
LAB_00155727:
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_00155c61:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_00155be5:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar10 = (long)piVar20 - (long)src;
    pBVar6 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar6 + uVar10) {
LAB_00155c42:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pInLimit < piVar20) {
LAB_00155c04:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_78 = piVar20;
    if (local_80 < piVar20) {
      ZSTD_safecopyLiterals(pBVar6,(BYTE *)src,(BYTE *)piVar20,(BYTE *)local_80);
LAB_00155792:
      seqStore->lit = seqStore->lit + uVar10;
      if (0xffff < uVar10) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar8 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar6 = *src;
      *(undefined8 *)(pBVar6 + 8) = uVar8;
      pBVar6 = seqStore->lit;
      if (0x10 < uVar10) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar6 + 0x10 + (-0x10 - ((long)src + 0x10))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar8 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar6 + 0x18) = uVar8;
        if (0x20 < (long)uVar10) {
          lVar13 = 0;
          do {
            puVar3 = (undefined8 *)((long)src + lVar13 + 0x20);
            uVar8 = puVar3[1];
            pBVar2 = pBVar6 + lVar13 + 0x20;
            *(undefined8 *)pBVar2 = *puVar3;
            *(undefined8 *)(pBVar2 + 8) = uVar8;
            puVar3 = (undefined8 *)((long)src + lVar13 + 0x30);
            uVar8 = puVar3[1];
            *(undefined8 *)(pBVar2 + 0x10) = *puVar3;
            *(undefined8 *)(pBVar2 + 0x18) = uVar8;
            lVar13 = lVar13 + 0x20;
          } while (pBVar2 + 0x20 < pBVar6 + uVar10);
        }
        goto LAB_00155792;
      }
      seqStore->lit = pBVar6 + uVar10;
    }
    psVar7 = seqStore->sequences;
    psVar7->litLength = (U16)uVar10;
    psVar7->offBase = (U32)sVar9;
    if (local_88 < 3) {
LAB_00155c23:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < local_88 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00155c80:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar7->mlBase = (U16)(local_88 - 3);
    seqStore->sequences = psVar7 + 1;
    if (ms->lazySkipping != 0) {
      uVar10 = (ulong)ms->nextToUpdate;
      UVar4 = ms->rowHashLog;
      uVar17 = ((int)piVar18 - (int)(local_60 + uVar10)) + 1;
      if (7 < uVar17) {
        uVar17 = 8;
      }
      if (piVar18 < local_60 + uVar10) {
        uVar17 = 0;
      }
      pUVar5 = ms->hashTable;
      pBVar6 = ms->tagTable;
      local_98 = (ulong)(uVar17 + ms->nextToUpdate);
      local_70 = (ulong)(0x38 - UVar4);
      local_8c = 0x18 - UVar4;
      local_90 = uVar16;
      for (; uVar10 < local_98; uVar10 = uVar10 + 1) {
        if (0x20 < UVar4 + 8) goto LAB_00155b88;
        plVar1 = (long *)(local_60 + uVar10);
        s = ms->hashSalt;
        if (uVar15 == 5) {
          sVar9 = (*plVar1 * -0x30e4432345000000 ^ s) >> ((byte)local_70 & 0x3f);
        }
        else if (uVar15 == 6) {
          sVar9 = ZSTD_hash6PtrS(plVar1,UVar4 + 8,s);
        }
        else {
          sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)s) >> ((byte)local_8c & 0x1f));
        }
        uVar17 = ((uint)(sVar9 >> 8) & 0xffffff) << (bVar12 & 0x1f);
        if (((ulong)(pUVar5 + uVar17) & 0x3f) != 0) goto LAB_00155ba7;
        iVar19 = ZSTD_isAligned(pBVar6 + uVar17,local_48);
        if (iVar19 == 0) goto LAB_00155bc6;
        ms->hashCache[(uint)uVar10 & 7] = (U32)sVar9;
      }
      ms->lazySkipping = 0;
      piVar18 = local_68;
      uVar16 = local_90;
    }
    for (src = (void *)((long)local_78 + local_88);
        ((uVar17 = uVar16, piVar20 = (int *)src, local_b0 != 0 && (src <= piVar18)) &&
        (*src == *(int *)((long)src - (ulong)local_b0))); src = (void *)((long)src + sVar9 + 4)) {
      sVar9 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_b0)),
                         (BYTE *)pInLimit);
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
      goto LAB_00155c61;
      if (0x20000 < seqStore->maxNbLit) goto LAB_00155be5;
      pBVar6 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar6) goto LAB_00155c42;
      if (pInLimit < src) goto LAB_00155c04;
      if (local_80 < src) {
        ZSTD_safecopyLiterals(pBVar6,(BYTE *)src,(BYTE *)src,(BYTE *)local_80);
      }
      else {
        uVar8 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar6 = *src;
        *(undefined8 *)(pBVar6 + 8) = uVar8;
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = 0;
      psVar7->offBase = 1;
      if (sVar9 + 4 < 3) goto LAB_00155c23;
      if (0xffff < sVar9 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00155c80;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)(sVar9 + 1);
      seqStore->sequences = psVar7 + 1;
      piVar18 = local_68;
      uVar16 = local_b0;
      local_b0 = uVar17;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_noDict);
}